

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O1

unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
__thiscall
duckdb::CompressedMaterialization::GetStringCompress
          (CompressedMaterialization *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *input,
          BaseStatistics *stats)

{
  BaseStatistics *pBVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  byte value;
  idx_t iVar7;
  Optimizer *this_00;
  BaseStatistics *in_RCX;
  BaseStatistics *stats_00;
  BaseStatistics *stats_01;
  ulong uVar8;
  pointer *__ptr;
  uint uVar9;
  LogicalType *pLVar10;
  templated_unique_single_t compress_expr;
  string min_string;
  Value max_val;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  arguments;
  ScalarFunction compress_function;
  BaseStatistics compress_stats;
  BaseStatistics *local_2e8;
  undefined1 local_2e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined1 local_2b0 [16];
  byte local_2a0 [16];
  string local_290;
  BaseStatistics *local_270;
  LogicalType local_268;
  LogicalType local_250;
  Value local_238;
  function_statistics_t local_1f8;
  element_type *peStack_1f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e8;
  ScalarFunction local_1b0;
  BaseStatistics local_88;
  
  bVar6 = StringStats::HasMaxStringLength(in_RCX);
  if (bVar6) {
    local_270 = stats;
    local_2c8._M_allocated_capacity._0_4_ = StringStats::MaxStringLength(in_RCX);
    LogicalType::LogicalType((LogicalType *)local_2e0,INVALID);
    CMUtils::StringTypes();
    if (local_1b0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
        (_func_int **)
        local_1b0.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus._M_p
       ) {
      uVar8 = (ulong)(uint)local_2c8._M_allocated_capacity._0_4_;
      pLVar10 = (LogicalType *)
                local_1b0.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                _vptr_Function;
      do {
        iVar7 = GetTypeIdSize(pLVar10->physical_type_);
        if (uVar8 < iVar7) {
          if (pLVar10 != (LogicalType *)local_2e0) {
            local_2e0[0] = pLVar10->id_;
            local_2e0[1] = pLVar10->physical_type_;
            shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                      ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(local_2e0 + 8),
                       &pLVar10->type_info_);
          }
          break;
        }
        pLVar10 = pLVar10 + 1;
      } while (pLVar10 !=
               (LogicalType *)
               local_1b0.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
               _M_dataplus._M_p);
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1b0);
    LogicalType::LogicalType((LogicalType *)&local_1b0,INVALID);
    bVar6 = LogicalType::operator==((LogicalType *)local_2e0,(LogicalType *)&local_1b0);
    pBVar1 = local_270;
    LogicalType::~LogicalType((LogicalType *)&local_1b0);
    if (bVar6) {
      this->optimizer = (Optimizer *)0x0;
    }
    else {
      LogicalType::LogicalType(&local_250,(LogicalType *)local_2e0);
      BaseStatistics::CreateEmpty(&local_88,&local_250);
      LogicalType::~LogicalType(&local_250);
      BaseStatistics::CopyBase(&local_88,in_RCX);
      if (local_2e0[0] == USMALLINT) {
        StringStats::Min_abi_cxx11_(&local_290,(StringStats *)in_RCX,stats_00);
        StringStats::Max_abi_cxx11_((string *)local_2b0,(StringStats *)in_RCX,stats_01);
        if (local_2c8._M_allocated_capacity._0_4_ == 0) {
          value = 0;
        }
        else {
          value = 0;
          if ((pointer)local_290._M_string_length != (pointer)0x0) {
            value = *local_290._M_dataplus._M_p;
          }
        }
        uVar9 = 0;
        if ((local_2c8._M_allocated_capacity._0_4_ != 0) && (uVar9 = 0, local_2b0._8_8_ != 0)) {
          uVar9 = (uint)*(byte *)local_2b0._0_8_;
        }
        Value::USMALLINT((Value *)&local_1f8,(ushort)value);
        Value::USMALLINT(&local_238,(uint16_t)(uVar9 + 1));
        if (uVar9 != 0xff) {
          LogicalType::LogicalType((LogicalType *)&local_1b0,UTINYINT);
          local_2e0[0] = (LogicalTypeId)
                         local_1b0.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                         _vptr_Function;
          local_2e0[1] = local_1b0.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                         _vptr_Function._1_1_;
          LogicalType::~LogicalType((LogicalType *)&local_1b0);
          LogicalType::LogicalType(&local_268,(LogicalType *)local_2e0);
          local_2c8._M_allocated_capacity._0_4_ = uVar9 + 1;
          BaseStatistics::CreateEmpty((BaseStatistics *)&local_1b0,&local_268);
          BaseStatistics::operator=(&local_88,(BaseStatistics *)&local_1b0);
          BaseStatistics::~BaseStatistics((BaseStatistics *)&local_1b0);
          LogicalType::~LogicalType(&local_268);
          BaseStatistics::CopyBase(&local_88,in_RCX);
          Value::UTINYINT((Value *)&local_1b0,value);
          uVar2 = local_2c8._M_allocated_capacity._0_4_;
          Value::operator=((Value *)&local_1f8,(Value *)&local_1b0);
          Value::~Value((Value *)&local_1b0);
          Value::UTINYINT((Value *)&local_1b0,(uint8_t)uVar2);
          Value::operator=(&local_238,(Value *)&local_1b0);
          Value::~Value((Value *)&local_1b0);
        }
        NumericStats::SetMin(&local_88,(Value *)&local_1f8);
        NumericStats::SetMax(&local_88,&local_238);
        Value::~Value(&local_238);
        Value::~Value((Value *)&local_1f8);
        if ((byte *)local_2b0._0_8_ != local_2a0) {
          operator_delete((void *)local_2b0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p);
        }
      }
      CMStringCompressFun::GetFunction(&local_1b0,(LogicalType *)local_2e0);
      local_1f8 = (function_statistics_t)0x0;
      peStack_1f0 = (element_type *)0x0;
      local_1e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_1f8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 pBVar1);
      local_238.type_.id_ = INVALID;
      local_238.type_.physical_type_ = ~INVALID;
      local_238.type_._2_6_ = 0;
      make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
                ((LogicalType *)local_2b0,(ScalarFunction *)local_2e0,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)&local_1b0,&local_1f8);
      BaseStatistics::ToUnique((BaseStatistics *)&local_2e8);
      this_00 = (Optimizer *)operator_new(0x10);
      uVar3 = local_2b0._0_8_;
      local_2b0._0_8_ = (byte *)0x0;
      uVar4 = local_2b0._0_8_;
      local_2b0[0] = (undefined1)uVar3;
      local_2b0[1] = SUB81(uVar3,1);
      local_2b0._2_6_ = SUB86(uVar3,2);
      local_238.type_.id_ = local_2b0[0];
      local_238.type_.physical_type_ = local_2b0[1];
      local_238.type_._2_6_ = local_2b0._2_6_;
      local_290._M_dataplus._M_p = (pointer)local_2e8;
      local_2e8 = (BaseStatistics *)0x0;
      local_2b0._0_8_ = uVar4;
      CompressExpression::CompressExpression
                ((CompressExpression *)this_00,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_238,
                 (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)&local_290);
      _Var5._M_p = local_290._M_dataplus._M_p;
      this->optimizer = this_00;
      if ((BaseStatistics *)local_290._M_dataplus._M_p != (BaseStatistics *)0x0) {
        BaseStatistics::~BaseStatistics((BaseStatistics *)local_290._M_dataplus._M_p);
        operator_delete(_Var5._M_p);
      }
      local_290._M_dataplus._M_p = (pointer)0x0;
      if ((byte *)local_238.type_._0_8_ != (byte *)0x0) {
        (**(code **)(*(long *)local_238.type_._0_8_ + 8))();
      }
      pBVar1 = local_2e8;
      if (local_2e8 != (BaseStatistics *)0x0) {
        BaseStatistics::~BaseStatistics(local_2e8);
        operator_delete(pBVar1);
      }
      if ((byte *)local_2b0._0_8_ != (byte *)0x0) {
        (**(code **)(*(long *)local_2b0._0_8_ + 8))();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_1f8);
      local_1b0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__ScalarFunction_01998f18;
      if (local_1b0.function_info.internal.
          super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1b0.function_info.internal.
                   super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_1b0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_1b0.function.super__Function_base._M_manager)
                  ((_Any_data *)&local_1b0.function,(_Any_data *)&local_1b0.function,
                   __destroy_functor);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_1b0.super_BaseScalarFunction);
      BaseStatistics::~BaseStatistics(&local_88);
    }
    LogicalType::~LogicalType((LogicalType *)local_2e0);
  }
  else {
    this->optimizer = (Optimizer *)0x0;
  }
  return (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>)
         (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>)
         this;
}

Assistant:

unique_ptr<CompressExpression> CompressedMaterialization::GetStringCompress(unique_ptr<Expression> input,
                                                                            const BaseStatistics &stats) {
	if (!StringStats::HasMaxStringLength(stats)) {
		return nullptr;
	}

	const auto max_string_length = StringStats::MaxStringLength(stats);
	LogicalType cast_type = LogicalType::INVALID;
	for (const auto &compressed_type : CMUtils::StringTypes()) {
		if (max_string_length < GetTypeIdSize(compressed_type.InternalType())) {
			cast_type = compressed_type;
			break;
		}
	}
	if (cast_type == LogicalType::INVALID) {
		return nullptr;
	}

	auto compress_stats = BaseStatistics::CreateEmpty(cast_type);
	compress_stats.CopyBase(stats);
	if (cast_type.id() == LogicalTypeId::USMALLINT) {
		auto min_string = StringStats::Min(stats);
		auto max_string = StringStats::Max(stats);

		uint8_t min_numeric = 0;
		if (max_string_length != 0 && !min_string.empty()) {
			min_numeric = *reinterpret_cast<const uint8_t *>(min_string.c_str());
		}
		uint8_t max_numeric = 0;
		if (max_string_length != 0 && !max_string.empty()) {
			max_numeric = *reinterpret_cast<const uint8_t *>(max_string.c_str());
		}

		Value min_val = Value::USMALLINT(min_numeric);
		Value max_val = Value::USMALLINT(max_numeric + 1);
		if (max_numeric < NumericLimits<uint8_t>::Maximum()) {
			cast_type = LogicalType::UTINYINT;
			compress_stats = BaseStatistics::CreateEmpty(cast_type);
			compress_stats.CopyBase(stats);
			min_val = Value::UTINYINT(min_numeric);
			max_val = Value::UTINYINT(max_numeric + 1);
		}

		NumericStats::SetMin(compress_stats, min_val);
		NumericStats::SetMax(compress_stats, max_val);
	}

	auto compress_function = CMStringCompressFun::GetFunction(cast_type);
	vector<unique_ptr<Expression>> arguments;
	arguments.emplace_back(std::move(input));
	auto compress_expr =
	    make_uniq<BoundFunctionExpression>(cast_type, compress_function, std::move(arguments), nullptr);
	return make_uniq<CompressExpression>(std::move(compress_expr), compress_stats.ToUnique());
}